

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

VRVector3 * __thiscall MinVR::VRVector3::normalize(VRVector3 *this)

{
  VRVector3 *in_RSI;
  VRVector3 *in_RDI;
  float fVar1;
  float zz;
  float yy;
  float xx;
  float scaleFactor;
  float sizeSq;
  float zz_00;
  
  fVar1 = in_RSI->z * in_RSI->z + in_RSI->x * in_RSI->x + in_RSI->y * in_RSI->y;
  zz_00 = (float)((ulong)in_RDI >> 0x20);
  if (1e-08 <= fVar1) {
    std::sqrt((double)(ulong)(uint)fVar1);
    VRVector3(in_RSI,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),zz_00);
  }
  else {
    VRVector3(in_RSI,zz_00,SUB84(in_RDI,0),zz_00);
  }
  return in_RDI;
}

Assistant:

VRVector3 VRVector3::normalize() {
  // Hill & Kelley provide this:
  float sizeSq = x*x + y*y + z*z; 
  if (sizeSq < VRMATH_EPSILON) { 
    return VRVector3(x,y,z); // does nothing to zero vectors;
  } 
  float scaleFactor = (float)1.0/(float)sqrt(sizeSq);
  float xx = x * scaleFactor; 
  float yy = y * scaleFactor;
  float zz = z * scaleFactor;
  return VRVector3(xx, yy, zz);
}